

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_forEachChildNodeCall
          (UA_Server *server,UA_NodeId parentNodeId,UA_NodeIteratorCallback callback,void *handle)

{
  size_t size;
  uint uVar1;
  UA_ReferenceNode *ref;
  size_t i;
  UA_StatusCode retval;
  size_t refssize;
  UA_ReferenceNode *refs;
  UA_Node *parent;
  void *handle_local;
  UA_NodeIteratorCallback callback_local;
  UA_Server *server_local;
  
  parent = (UA_Node *)handle;
  handle_local = callback;
  callback_local = (UA_NodeIteratorCallback)server;
  refs = (UA_ReferenceNode *)UA_NodeStore_get(server->nodestore,&parentNodeId);
  if ((UA_Node *)refs == (UA_Node *)0x0) {
    server_local._4_4_ = 0x80330000;
  }
  else {
    refssize = 0;
    size = ((UA_Node *)refs)->referencesSize;
    i._4_4_ = UA_Array_copy(((UA_Node *)refs)->references,((UA_Node *)refs)->referencesSize,
                            (void **)&refssize,UA_TYPES + 0x38);
    server_local._4_4_ = i._4_4_;
    if (i._4_4_ == 0) {
      for (ref = (UA_ReferenceNode *)refs[1].targetId.nodeId.identifier.string.data;
          ref != (UA_ReferenceNode *)0x0; ref = (UA_ReferenceNode *)&ref[-1].targetId.field_0x2f) {
        uVar1 = (*(code *)handle_local)
                          (*(byte *)(refssize + (long)&ref[-1].targetId.field_0x2f * 0x50 + 0x18) &
                           1,parent);
        i._4_4_ = uVar1 | i._4_4_;
      }
      UA_Array_delete((void *)refssize,size,UA_TYPES + 0x38);
      server_local._4_4_ = i._4_4_;
    }
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Server_forEachChildNodeCall(UA_Server *server, UA_NodeId parentNodeId,
                               UA_NodeIteratorCallback callback, void *handle) {
    UA_RCU_LOCK();
    const UA_Node *parent = UA_NodeStore_get(server->nodestore, &parentNodeId);
    if(!parent) {
        UA_RCU_UNLOCK();
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* TODO: We need to do an ugly copy of the references array since users may
     * delete references from within the callback. In single-threaded mode this
     * changes the same node we point at here. In multi-threaded mode, this
     * creates a new copy as nodes are truly immutable. */
    UA_ReferenceNode *refs = NULL;
    size_t refssize = parent->referencesSize;
    UA_StatusCode retval = UA_Array_copy(parent->references, parent->referencesSize,
                                         (void**)&refs, &UA_TYPES[UA_TYPES_REFERENCENODE]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_RCU_UNLOCK();
        return retval;
    }

    for(size_t i = parent->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &refs[i-1];
        retval |= callback(ref->targetId.nodeId, ref->isInverse,
                           ref->referenceTypeId, handle);
    }
    UA_RCU_UNLOCK();

    UA_Array_delete(refs, refssize, &UA_TYPES[UA_TYPES_REFERENCENODE]);
    return retval;
}